

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemmodel_p.h
# Opt level: O0

int __thiscall
QFileSystemModelPrivate::translateVisibleLocation
          (QFileSystemModelPrivate *this,QFileSystemNode *parent,int row)

{
  qsizetype qVar1;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  undefined4 local_4;
  
  local_4 = in_EDX;
  if (*(int *)(in_RDI + 0x1ac) != 0) {
    if (*(int *)(in_RSI + 0x48) == -1) {
      qVar1 = QList<QString>::size((QList<QString> *)(in_RSI + 0x20));
      local_4 = ((int)qVar1 - in_EDX) + -1;
    }
    else if (in_EDX < *(int *)(in_RSI + 0x48)) {
      local_4 = (*(int *)(in_RSI + 0x48) - in_EDX) + -1;
    }
  }
  return local_4;
}

Assistant:

inline int translateVisibleLocation(QFileSystemNode *parent, int row) const {
        if (sortOrder != Qt::AscendingOrder) {
            if (parent->dirtyChildrenIndex == -1)
                return parent->visibleChildren.size() - row - 1;

            if (row < parent->dirtyChildrenIndex)
                return parent->dirtyChildrenIndex - row - 1;
        }

        return row;
    }